

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool f_check(int m,int n)

{
  int n_local;
  int m_local;
  
  if (m < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"F_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  M <= 0.\n");
    n_local._3_1_ = false;
  }
  else if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"F_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  N <= 0.\n");
    n_local._3_1_ = false;
  }
  else {
    n_local._3_1_ = true;
  }
  return n_local._3_1_;
}

Assistant:

bool f_check ( int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_CHECK checks the parameters of the F PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    25 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, bool F_CHECK, is true if the parameters are legal.
//
{
  if ( m <= 0 )
  {
    cerr << "\n";
    cerr << "F_CHECK - Warning!\n";
    cerr << "  M <= 0.\n";
    return false;
  }

  if ( n <= 0 )
  {
    cerr << "\n";
    cerr << "F_CHECK - Warning!\n";
    cerr << "  N <= 0.\n";
    return false;
  }

  return true;
}